

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O0

void rf_draw_circle_sector
               (rf_vec2 center,float radius,int start_angle,int end_angle,int segments,
               rf_color color)

{
  _Bool _Var1;
  float fVar2;
  float fVar3;
  float fVar4;
  undefined8 local_40;
  rf_int i;
  float angle;
  float step_length;
  float th;
  float CIRCLE_ERROR_RATE;
  int tmp;
  int segments_local;
  int end_angle_local;
  int start_angle_local;
  float radius_local;
  rf_color color_local;
  rf_vec2 center_local;
  
  end_angle_local = (int)radius;
  if (radius <= 0.0) {
    end_angle_local = 0x3dcccccd;
  }
  tmp = end_angle;
  segments_local = start_angle;
  if (end_angle < start_angle) {
    tmp = start_angle;
    segments_local = end_angle;
  }
  CIRCLE_ERROR_RATE = (float)segments;
  if (segments < 4) {
    fVar2 = powf(1.0 - 0.5 / (float)end_angle_local,2.0);
    fVar2 = acosf(fVar2 + fVar2 + -1.0);
    fVar2 = ceilf(6.2831855 / fVar2);
    CIRCLE_ERROR_RATE = (float)(int)(((float)(tmp - segments_local) * fVar2) / 360.0);
    if ((int)CIRCLE_ERROR_RATE < 1) {
      CIRCLE_ERROR_RATE = 5.60519e-45;
    }
  }
  fVar2 = (float)(tmp - segments_local) / (float)(int)CIRCLE_ERROR_RATE;
  i._0_4_ = (float)segments_local;
  _Var1 = rf_gfx_check_buffer_limit((int)CIRCLE_ERROR_RATE * 3);
  if (_Var1) {
    rf_gfx_draw();
  }
  rf_gfx_begin(RF_TRIANGLES);
  for (local_40 = 0; local_40 < (int)CIRCLE_ERROR_RATE; local_40 = local_40 + 1) {
    start_angle_local._0_1_ = color.r;
    start_angle_local._1_1_ = color.g;
    start_angle_local._2_1_ = color.b;
    start_angle_local._3_1_ = color.a;
    rf_gfx_color4ub((uchar)start_angle_local,start_angle_local._1_1_,start_angle_local._2_1_,
                    start_angle_local._3_1_);
    radius_local = center.x;
    color_local = (rf_color)center.y;
    rf_gfx_vertex2f(radius_local,(float)color_local);
    fVar3 = sinf((float)i * 0.017453292);
    fVar4 = cosf((float)i * 0.017453292);
    rf_gfx_vertex2f(fVar3 * (float)end_angle_local + radius_local,
                    fVar4 * (float)end_angle_local + (float)color_local);
    fVar3 = sinf(((float)i + fVar2) * 0.017453292);
    fVar4 = cosf(((float)i + fVar2) * 0.017453292);
    rf_gfx_vertex2f(fVar3 * (float)end_angle_local + radius_local,
                    fVar4 * (float)end_angle_local + (float)color_local);
    i._0_4_ = fVar2 + (float)i;
  }
  rf_gfx_end();
  return;
}

Assistant:

RF_API void rf_draw_circle_sector(rf_vec2 center, float radius, int start_angle, int end_angle, int segments, rf_color color)
{
    if (radius <= 0.0f) radius = 0.1f; // Avoid div by zero

    // Function expects (endAngle > start_angle)
    if (end_angle < start_angle)
    {
        // Swap values
        int tmp = start_angle;
        start_angle = end_angle;
        end_angle = tmp;
    }

    if (segments < 4)
    {
        // Calculate how many segments we need to draw a smooth circle, taken from https://stackoverflow.com/a/2244088
        float CIRCLE_ERROR_RATE = 0.5f;

        // Calculate the maximum angle between segments based on the error rate.
        float th = acosf(2*powf(1 - CIRCLE_ERROR_RATE/radius, 2) - 1);
        segments = (end_angle - start_angle) * ceilf(2 * RF_PI / th) / 360;

        if (segments <= 0) segments = 4;
    }

    float step_length = (float)(end_angle - start_angle)/(float)segments;
    float angle = start_angle;
    if (rf_gfx_check_buffer_limit(3*segments)) rf_gfx_draw();

    rf_gfx_begin(RF_TRIANGLES);
    for (rf_int i = 0; i < segments; i++)
    {
        rf_gfx_color4ub(color.r, color.g, color.b, color.a);

        rf_gfx_vertex2f(center.x, center.y);
        rf_gfx_vertex2f(center.x + sinf(RF_DEG2RAD*angle)*radius, center.y + cosf(RF_DEG2RAD*angle)*radius);
        rf_gfx_vertex2f(center.x + sinf(RF_DEG2RAD*(angle + step_length))*radius, center.y + cosf(RF_DEG2RAD*(angle + step_length))*radius);

        angle += step_length;
    }
    rf_gfx_end();
}